

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_add_body_amqp_data(MESSAGE_HANDLE message,BINARY_DATA amqp_data)

{
  MESSAGE_BODY_TYPE MVar1;
  LOGGER_LOG p_Var2;
  BODY_AMQP_DATA *pBVar3;
  uchar *puVar4;
  size_t __size;
  uchar *__src;
  size_t local_88;
  size_t local_80;
  ulong local_78;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  BODY_AMQP_DATA *new_body_amqp_data_items;
  LOGGER_LOG l_2;
  size_t realloc_size;
  LOGGER_LOG l_1;
  MESSAGE_BODY_TYPE body_type;
  LOGGER_LOG l;
  int result;
  MESSAGE_HANDLE message_local;
  BINARY_DATA amqp_data_local;
  
  __size = amqp_data.length;
  __src = amqp_data.bytes;
  if ((message == (MESSAGE_HANDLE)0x0) || ((__src == (uchar *)0x0 && (__size != 0)))) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_add_body_amqp_data",0x405,1,
                "Bad arguments: message = %p, bytes = %p, length = %u",message,__src,
                (int)amqp_data.length);
    }
    l._4_4_ = 0x406;
  }
  else {
    MVar1 = internal_get_body_type(message);
    if ((MVar1 == MESSAGE_BODY_TYPE_SEQUENCE) || (MVar1 == MESSAGE_BODY_TYPE_VALUE)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_add_body_amqp_data",0x40f,1,"Body type already set");
      }
      l._4_4_ = 0x410;
    }
    else {
      if (message->body_amqp_data_count < 0xfffffffffffffffe) {
        local_78 = message->body_amqp_data_count + 1;
      }
      else {
        local_78 = 0xffffffffffffffff;
      }
      if (local_78 == 0) {
        local_80 = 0;
      }
      else {
        if (local_78 < 0x1000000000000000) {
          local_88 = local_78 << 4;
        }
        else {
          local_88 = 0xffffffffffffffff;
        }
        local_80 = local_88;
      }
      if (local_80 == 0xffffffffffffffff) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                    ,"message_add_body_amqp_data",0x419,1,
                    "Invalid size for new_body_amqp_data_items");
        }
        l._4_4_ = 0x41a;
      }
      else {
        pBVar3 = (BODY_AMQP_DATA *)realloc(message->body_amqp_data_items,local_80);
        if (pBVar3 == (BODY_AMQP_DATA *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_add_body_amqp_data",0x423,1,
                      "Cannot allocate memory for body AMQP data items");
          }
          l._4_4_ = 0x424;
        }
        else {
          message->body_amqp_data_items = pBVar3;
          if (__size == 0) {
            message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes =
                 (uchar *)0x0;
            message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_length =
                 0;
            message->body_amqp_data_count = message->body_amqp_data_count + 1;
            l._4_4_ = 0;
          }
          else {
            puVar4 = (uchar *)malloc(__size);
            message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes =
                 puVar4;
            if (message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes
                == (uchar *)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                          ,"message_add_body_amqp_data",0x439,1,
                          "Cannot allocate memory for body AMQP data to be added");
              }
              l._4_4_ = 0x43a;
            }
            else {
              message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_length
                   = __size;
              memcpy(message->body_amqp_data_items[message->body_amqp_data_count].
                     body_data_section_bytes,__src,__size);
              message->body_amqp_data_count = message->body_amqp_data_count + 1;
              l._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

int message_add_body_amqp_data(MESSAGE_HANDLE message, BINARY_DATA amqp_data)
{
    int result;

    /* Codes_SRS_MESSAGE_01_088: [ If `message` is NULL, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
    if ((message == NULL) ||
        /* Tests_SRS_MESSAGE_01_089: [ If the `bytes` member of `amqp_data` is NULL and the `size` member is non-zero, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
        ((amqp_data.bytes == NULL) &&
            (amqp_data.length != 0)))
    {
        LogError("Bad arguments: message = %p, bytes = %p, length = %u",
            message, amqp_data.bytes, (unsigned int)amqp_data.length);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if ((body_type == MESSAGE_BODY_TYPE_SEQUENCE) ||
            (body_type == MESSAGE_BODY_TYPE_VALUE))
        {
            /* Codes_SRS_MESSAGE_01_091: [ If the body was already set to an AMQP value or a list of AMQP sequences, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
            LogError("Body type already set");
            result = MU_FAILURE;
        }
        else
        {
            size_t realloc_size = safe_add_size_t(message->body_amqp_data_count, 1);
            realloc_size = safe_multiply_size_t(sizeof(BODY_AMQP_DATA), realloc_size);

            if (realloc_size == SIZE_MAX)
            {
                LogError("Invalid size for new_body_amqp_data_items");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_086: [ `message_add_body_amqp_data` shall add the contents of `amqp_data` to the list of AMQP data values for the body of the message identified by `message`. ]*/
                BODY_AMQP_DATA* new_body_amqp_data_items = (BODY_AMQP_DATA*)realloc(message->body_amqp_data_items, realloc_size);
                if (new_body_amqp_data_items == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_153: [ If allocating memory to store the added AMQP data fails, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
                    LogError("Cannot allocate memory for body AMQP data items");
                    result = MU_FAILURE;
                }
                else
                {
                    message->body_amqp_data_items = new_body_amqp_data_items;

                    if (amqp_data.length == 0)
                    {
                        message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes = NULL;
                        message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_length = 0;
                        message->body_amqp_data_count++;

                        /* Codes_SRS_MESSAGE_01_087: [ On success it shall return 0. ]*/
                        result = 0;
                    }
                    else
                    {
                        message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes = (unsigned char*)malloc(amqp_data.length);
                        if (message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes == NULL)
                        {
                            /* Codes_SRS_MESSAGE_01_153: [ If allocating memory to store the added AMQP data fails, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
                            LogError("Cannot allocate memory for body AMQP data to be added");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_length = amqp_data.length;
                            (void)memcpy(message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes, amqp_data.bytes, amqp_data.length);
                            message->body_amqp_data_count++;

                            /* Codes_SRS_MESSAGE_01_087: [ On success it shall return 0. ]*/
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}